

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H30_binary_tree.c
# Opt level: O2

void insert(int key)

{
  NODE *pNVar1;
  node *pnVar2;
  NODE **ppNVar3;
  
  ppNVar3 = &root;
  while( true ) {
    pNVar1 = *ppNVar3;
    if (pNVar1 == (NODE *)0x0) {
      pnVar2 = (node *)malloc(0x18);
      pnVar2->left = (node *)0x0;
      pnVar2->right = (node *)0x0;
      pnVar2->data = key;
      *ppNVar3 = pnVar2;
      return;
    }
    if (pNVar1->data == key) break;
    ppNVar3 = &pNVar1->left + (pNVar1->data <= key);
  }
  return;
}

Assistant:

void insert(int key) {
  NODE **p, *n;
  p = &root;
  while (*p != NULL) {
    if (key == (*p)->data)
      return;
    else if (key < (*p)->data)
      p = &(*p)->left;
    else
      p = &(*p)->right;
  }

  n = (NODE *)malloc(sizeof(NODE));
  n->left = NULL;
  n->right = NULL;
  n->data = key;
  *p = n;
}